

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.c
# Opt level: O2

_Bool upb_FieldDef_IsPacked(upb_FieldDef *f)

{
  google_protobuf_FeatureSet *msg;
  _Bool _Var1;
  uint in_EAX;
  int32_t ret;
  int32_t default_val;
  undefined8 local_18;
  
  local_18._0_4_ = in_EAX;
  _Var1 = _upb_FieldDef_IsPackable(f);
  if (_Var1) {
    msg = f->resolved_features;
    local_18 = (ulong)(uint)local_18;
    _Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                      ((upb_MiniTableField *)&DAT_00133cbc,(void *)((long)&local_18 + 4));
    if (!_Var1) {
      _Var1 = upb_Message_HasBaseField
                        (&msg->base_dont_copy_me__upb_internal_use_only,
                         (upb_MiniTableField *)&DAT_00133cbc);
      if (!_Var1) goto LAB_0011a00f;
    }
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
              ((upb_MiniTableField *)&DAT_00133cbc,&local_18,
               (void *)((long)&msg[2].base_dont_copy_me__upb_internal_use_only.field_0 + 4));
    _Var1 = (uint)local_18 == 1;
  }
  else {
LAB_0011a00f:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool upb_FieldDef_IsPacked(const upb_FieldDef* f) {
  return _upb_FieldDef_IsPackable(f) &&
         UPB_DESC(FeatureSet_repeated_field_encoding(f->resolved_features)) ==
             UPB_DESC(FeatureSet_PACKED);
}